

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_invalid_bias_or_compare
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  DataType DVar1;
  DataType DVar2;
  bool bVar3;
  bool bVar4;
  ContextType CVar5;
  char *__s;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  DataType dataType;
  DataType dataType_00;
  long lVar9;
  string shaderSource;
  _Alloc_hider _Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_780;
  DataType local_76c;
  long local_768;
  allocator<char> local_759;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  long local_98;
  string local_90;
  string local_70;
  string local_50;
  
  _Var10._M_p = (pointer)&local_780;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff870,"texture: Invalid bias/compare type.","");
  NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffff870);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p != &local_780) {
    operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
  }
  lVar9 = 0;
  do {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar9];
    bVar3 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar3) {
      local_98 = lVar9;
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_758,__s,&local_759);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_758,0,(char *)0x0,0x1cc56f3);
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar7) {
        local_780._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_780._8_8_ = plVar6[3];
        _Var10._M_p = (pointer)&local_780;
      }
      else {
        local_780._M_allocated_capacity = paVar7->_M_allocated_capacity;
        _Var10._M_p = (pointer)*plVar6;
      }
      lVar9 = plVar6[1];
      *plVar6 = (long)paVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffff870);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var10._M_p != &local_780) {
        operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_758._M_dataplus._M_p != &local_758.field_2) {
        operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
      }
      lVar8 = 0;
      do {
        local_768 = lVar8;
        if (lVar8 != 0) {
          DVar1 = *(DataType *)
                   ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes + lVar8)
          ;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x28,
                     TYPE_FLOAT_VEC2,DVar1,(DataType)_Var10._M_p);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x35,
                     TYPE_FLOAT_VEC2,DVar1,(DataType)_Var10._M_p);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3c,
                     TYPE_FLOAT_VEC2,DVar1,(DataType)_Var10._M_p);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
        }
        local_76c = *(DataType *)
                     ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes +
                     local_768);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x28,TYPE_FLOAT_VEC2
                   ,local_76c,(DataType)_Var10._M_p);
        local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_698,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_698);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_698._M_dataplus._M_p != &local_698.field_2) {
          operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        DVar1 = *(DataType *)
                 ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes +
                 local_768);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x35,TYPE_FLOAT_VEC2
                   ,DVar1,(DataType)_Var10._M_p);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x35,TYPE_FLOAT_VEC2
                   ,local_76c,(DataType)_Var10._M_p);
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3c,TYPE_FLOAT_VEC2
                   ,DVar1,(DataType)_Var10._M_p);
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3c,TYPE_FLOAT_VEC2
                   ,local_76c,(DataType)_Var10._M_p);
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3c,TYPE_FLOAT_VEC2
                   ,DVar1,(DataType)_Var10._M_p);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        if (local_768 != 0) {
          DVar2 = *(DataType *)
                   ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                   local_768);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2c,
                     TYPE_FLOAT_VEC3,DVar2,(DataType)_Var10._M_p);
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_1b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x39,
                     TYPE_FLOAT_VEC3,DVar2,(DataType)_Var10._M_p);
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x40,
                     TYPE_FLOAT_VEC3,DVar2,(DataType)_Var10._M_p);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1f8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2c,TYPE_FLOAT_VEC3
                   ,local_76c,(DataType)_Var10._M_p);
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_218,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2c,TYPE_FLOAT_VEC3
                   ,DVar1,(DataType)_Var10._M_p);
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_238,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x39,TYPE_FLOAT_VEC3
                   ,local_76c,(DataType)_Var10._M_p);
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_258,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x39,TYPE_FLOAT_VEC3
                   ,DVar1,(DataType)_Var10._M_p);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x40,TYPE_FLOAT_VEC3
                   ,local_76c,(DataType)_Var10._M_p);
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x40,TYPE_FLOAT_VEC3
                   ,DVar1,(DataType)_Var10._M_p);
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        if (local_768 != 0) {
          DVar2 = *(DataType *)
                   ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                   local_768);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x29,
                     TYPE_FLOAT_VEC3,DVar2,(DataType)_Var10._M_p);
          local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_6b8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_6b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
            operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&local_758,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x36,
                     TYPE_FLOAT_VEC3,DVar2,(DataType)_Var10._M_p);
          std::__cxx11::string::operator=((string *)&stack0xfffffffffffff870,(string *)&local_758);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_758._M_dataplus._M_p != &local_758.field_2) {
            operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
          }
          local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_6d8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_6d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
            operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&local_758,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3d,
                     TYPE_FLOAT_VEC3,DVar2,(DataType)_Var10._M_p);
          std::__cxx11::string::operator=((string *)&stack0xfffffffffffff870,(string *)&local_758);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_758._M_dataplus._M_p != &local_758.field_2) {
            operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
          }
          local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_6f8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_6f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
            operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x29,TYPE_FLOAT_VEC3
                   ,local_76c,(DataType)_Var10._M_p);
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_2d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x29,TYPE_FLOAT_VEC3
                   ,DVar1,(DataType)_Var10._M_p);
        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_2f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x36,TYPE_FLOAT_VEC3
                   ,local_76c,(DataType)_Var10._M_p);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_318,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_318);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x36,TYPE_FLOAT_VEC3
                   ,DVar1,(DataType)_Var10._M_p);
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_338,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_338);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3d,TYPE_FLOAT_VEC3
                   ,local_76c,(DataType)_Var10._M_p);
        local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_358,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_358);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3d,TYPE_FLOAT_VEC3
                   ,DVar1,(DataType)_Var10._M_p);
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_378,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_378);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        if (local_768 != 0) {
          DVar2 = *(DataType *)
                   ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                   local_768);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2b,
                     TYPE_FLOAT_VEC3,DVar2,(DataType)_Var10._M_p);
          local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_398,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_398);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x38,
                     TYPE_FLOAT_VEC3,DVar2,(DataType)_Var10._M_p);
          local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3b8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_3b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
            operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3f,
                     TYPE_FLOAT_VEC3,DVar2,(DataType)_Var10._M_p);
          local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3d8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_3d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2b,TYPE_FLOAT_VEC3
                   ,local_76c,(DataType)_Var10._M_p);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3f8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2b,TYPE_FLOAT_VEC3
                   ,DVar1,(DataType)_Var10._M_p);
        local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_418,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != &local_418.field_2) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x38,TYPE_FLOAT_VEC3
                   ,local_76c,(DataType)_Var10._M_p);
        local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_438,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_438);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x38,TYPE_FLOAT_VEC3
                   ,DVar1,(DataType)_Var10._M_p);
        local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_458,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_458);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3f,TYPE_FLOAT_VEC3
                   ,local_76c,(DataType)_Var10._M_p);
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_478,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_478);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != &local_478.field_2) {
          operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3f,TYPE_FLOAT_VEC3
                   ,DVar1,(DataType)_Var10._M_p);
        local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_498,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_498);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        if (local_768 != 0) {
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2f,
                     TYPE_FLOAT_VEC3,
                     *(DataType *)
                      ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                      local_768),(DataType)_Var10._M_p);
          local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4b8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_4b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
            operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2f,TYPE_FLOAT_VEC3
                   ,local_76c,(DataType)_Var10._M_p);
        local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4d8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_4d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
          operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2f,TYPE_FLOAT_VEC3
                   ,DVar1,(DataType)_Var10._M_p);
        local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4f8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_4f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
          operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        if (local_768 != 0) {
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x30,
                     TYPE_FLOAT_VEC4,
                     *(DataType *)
                      ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                      local_768),(DataType)_Var10._M_p);
          local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_518,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_518);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != &local_518.field_2) {
            operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x30,TYPE_FLOAT_VEC4
                   ,local_76c,(DataType)_Var10._M_p);
        local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_538,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_538);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._M_dataplus._M_p != &local_538.field_2) {
          operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x30,TYPE_FLOAT_VEC4
                   ,DVar1,(DataType)_Var10._M_p);
        local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_558,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_558);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._M_dataplus._M_p != &local_558.field_2) {
          operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_780) {
          operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
        }
        CVar5.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
        bVar4 = glu::contextSupports(CVar5,(ApiType)0x23);
        bVar3 = true;
        if (!bVar4) {
          NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_50,(_anonymous_namespace_ *)0x2d,dataType);
          bVar3 = NegativeTestContext::isExtensionSupported(ctx,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar3 != false) {
          if (local_768 != 0) {
            DVar2 = *(DataType *)
                     ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                     local_768);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2d,
                       TYPE_FLOAT_VEC4,DVar2,(DataType)_Var10._M_p);
            local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_578,_Var10._M_p,_Var10._M_p + lVar9);
            verifyShader(ctx,shaderType,&local_578);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_578._M_dataplus._M_p != &local_578.field_2) {
              operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var10._M_p != &local_780) {
              operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
            }
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3a,
                       TYPE_FLOAT_VEC4,DVar2,(DataType)_Var10._M_p);
            local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_598,_Var10._M_p,_Var10._M_p + lVar9);
            verifyShader(ctx,shaderType,&local_598);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_598._M_dataplus._M_p != &local_598.field_2) {
              operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var10._M_p != &local_780) {
              operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
            }
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x41,
                       TYPE_FLOAT_VEC4,DVar2,(DataType)_Var10._M_p);
            local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_5b8,_Var10._M_p,_Var10._M_p + lVar9);
            verifyShader(ctx,shaderType,&local_5b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
              operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var10._M_p != &local_780) {
              operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
            }
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2d,
                     TYPE_FLOAT_VEC4,local_76c,(DataType)_Var10._M_p);
          local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_718,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_718);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_718._M_dataplus._M_p != &local_718.field_2) {
            operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2d,
                     TYPE_FLOAT_VEC4,DVar1,(DataType)_Var10._M_p);
          local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_738,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_738);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_738._M_dataplus._M_p != &local_738.field_2) {
            operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3a,
                     TYPE_FLOAT_VEC4,local_76c,(DataType)_Var10._M_p);
          local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5d8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_5d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
            operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3a,
                     TYPE_FLOAT_VEC4,DVar1,(DataType)_Var10._M_p);
          local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5f8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_5f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
            operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x41,
                     TYPE_FLOAT_VEC4,local_76c,(DataType)_Var10._M_p);
          local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_618,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_618);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_618._M_dataplus._M_p != &local_618.field_2) {
            operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x41,
                     TYPE_FLOAT_VEC4,DVar1,(DataType)_Var10._M_p);
          local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_638,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_638);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_638._M_dataplus._M_p != &local_638.field_2) {
            operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
        }
        CVar5.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
        bVar4 = glu::contextSupports(CVar5,(ApiType)0x23);
        bVar3 = true;
        if (!bVar4) {
          NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_70,(_anonymous_namespace_ *)0x33,dataType_00);
          bVar3 = NegativeTestContext::isExtensionSupported(ctx,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar3 != false) {
          if (local_768 != 0) {
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x33,
                       TYPE_FLOAT_VEC4,
                       *(DataType *)
                        ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                        local_768),(DataType)_Var10._M_p);
            local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_658,_Var10._M_p,_Var10._M_p + lVar9);
            verifyShader(ctx,shaderType,&local_658);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_658._M_dataplus._M_p != &local_658.field_2) {
              operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var10._M_p != &local_780) {
              operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
            }
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x33,
                     TYPE_FLOAT_VEC4,local_76c,(DataType)_Var10._M_p);
          local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_678,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_678);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_678._M_dataplus._M_p != &local_678.field_2) {
            operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff870,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x33,
                     TYPE_FLOAT_VEC4,DVar1,(DataType)_Var10._M_p);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_780) {
            operator_delete(_Var10._M_p,local_780._M_allocated_capacity + 1);
          }
        }
        lVar8 = local_768 + 4;
      } while (lVar8 != 0x10);
      NegativeTestContext::endSection(ctx);
      lVar9 = local_98;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 6);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void texture_invalid_bias_or_compare (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	ctx.beginSection("texture: Invalid bias/compare type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
			{
				// SAMPLER_2D
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_3D
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					shaderSource = genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]);
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					shaderSource = genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]);
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_2D_ARRAY
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_2D_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE_ARRAY
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY)))
				{
					if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
					{
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}

				// SAMPLER_CUBE_ARRAY_SHADOW
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW)))
				{
					if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
					{
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}